

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::perturbMin
          (SPxSolverBase<double> *this,UpdateVector<double> *uvec,VectorBase<double> *p_low,
          VectorBase<double> *p_up,double eps,double p_delta,int start,int incr)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  double dVar6;
  double dVar7;
  Real RVar8;
  double dVar9;
  Status SVar10;
  uint uVar11;
  long in_FS_OFFSET;
  double dVar12;
  double dVar13;
  
  pdVar4 = (uvec->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar6 = p_delta * 10.0;
  dVar7 = p_delta * 100.0;
  if (this->fullPerturbation == true) {
    uVar11 = ~start + (int)((ulong)((long)(uvec->super_VectorBase<double>).val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4)
                           >> 3);
    if (-1 < (int)uVar11) {
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      do {
        dVar13 = (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        dVar2 = (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        dVar12 = pdVar4[uVar11];
        ::soplex::infinity::__tls_init();
        if (((dVar13 - dVar1 < -p_delta) && (p_delta < ABS(dVar2 - dVar13))) &&
           (dVar13 <= dVar12 + p_delta)) {
          RVar8 = Random::next_random(&this->random);
          dVar9 = RVar8 * dVar7 + (1.0 - RVar8) * dVar6 + dVar12;
          (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = dVar9;
          this->theShift = (dVar9 - dVar13) + this->theShift;
        }
        ::soplex::infinity::__tls_init();
        if (((p_delta < dVar2 + dVar1) && (p_delta < ABS(dVar2 - dVar13))) &&
           (dVar12 - p_delta <= dVar2)) {
          RVar8 = Random::next_random(&this->random);
          dVar12 = dVar12 - (RVar8 * dVar7 + (1.0 - RVar8) * dVar6);
          (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = dVar12;
          this->theShift = this->theShift - (dVar12 - dVar2);
        }
        uVar11 = uVar11 - incr;
      } while (-1 < (int)uVar11);
    }
  }
  else {
    uVar11 = ~start + (uvec->thedelta).super_IdxSet.num;
    if (-1 < (int)uVar11) {
      pdVar5 = (uvec->thedelta).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      do {
        iVar3 = (uvec->thedelta).super_IdxSet.idx[uVar11];
        dVar13 = pdVar5[iVar3];
        dVar2 = (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3];
        dVar12 = (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        SVar10 = SPxBasisBase<double>::dualStatus
                           (&this->super_SPxBasisBase<double>,
                            (this->super_SPxBasisBase<double>).theBaseId.data + iVar3);
        if (SVar10 != D_ON_BOTH) {
          if (-eps <= dVar13) {
            if ((((eps < dVar13) && (::soplex::infinity::__tls_init(), eps < dVar12 + dVar1)) &&
                (eps < ABS(dVar12 - dVar2))) && (dVar13 = pdVar4[iVar3], dVar13 <= dVar12 + eps)) {
              RVar8 = Random::next_random(&this->random);
              dVar13 = dVar13 - (RVar8 * dVar7 + (1.0 - RVar8) * dVar6);
              (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] = dVar13;
              this->theShift = this->theShift - (dVar13 - dVar12);
            }
          }
          else {
            ::soplex::infinity::__tls_init();
            if (((dVar2 - dVar1 < -eps) && (eps < ABS(dVar12 - dVar2))) &&
               (dVar13 = pdVar4[iVar3], dVar2 - eps <= dVar13)) {
              RVar8 = Random::next_random(&this->random);
              dVar13 = dVar13 + RVar8 * dVar7 + (1.0 - RVar8) * dVar6;
              (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] = dVar13;
              this->theShift = (dVar13 - dVar2) + this->theShift;
            }
          }
        }
        uVar11 = uVar11 - incr;
      } while (-1 < (int)uVar11);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMin(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps)
         {
            p_up[i] = x + random.next((double) minrandom, (double)maxrandom);
            theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps)
         {
            p_low[i] = x - random.next((double)minrandom, (double)maxrandom);
            theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         // do not permute these bounds! c.f. with computeFrhs2() in spxvecs.cpp
         if(this->dualStatus(this->baseId(i)) == SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            continue;
         }

         if(x < -eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               theShift += p_up[i] - u;
            }
         }
         else if(x > eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               theShift -= p_low[i] - l;
            }
         }
      }
   }
}